

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_collation_needed
              (sqlite3 *db,void *pCollNeededArg,
              _func_void_void_ptr_sqlite3_ptr_int_char_ptr *xCollNeeded)

{
  sqlite3_mutex *psVar1;
  
  if (db->mutex == (sqlite3_mutex *)0x0) {
    psVar1 = (sqlite3_mutex *)0x0;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    psVar1 = db->mutex;
  }
  db->xCollNeeded = xCollNeeded;
  db->xCollNeeded16 = (_func_void_void_ptr_sqlite3_ptr_int_void_ptr *)0x0;
  db->pCollNeededArg = pCollNeededArg;
  if (psVar1 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar1);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_collation_needed(
  sqlite3 *db, 
  void *pCollNeededArg, 
  void(*xCollNeeded)(void*,sqlite3*,int eTextRep,const char*)
){
  sqlite3_mutex_enter(db->mutex);
  db->xCollNeeded = xCollNeeded;
  db->xCollNeeded16 = 0;
  db->pCollNeededArg = pCollNeededArg;
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}